

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_ar.c
# Opt level: O0

size_t WebRtcSpl_FilterAR(int16_t *a,size_t a_length,int16_t *x,size_t x_length,int16_t *state,
                         size_t state_length,int16_t *state_low,size_t state_low_length,
                         int16_t *filtered,int16_t *filtered_low,size_t filtered_low_length)

{
  size_t sVar1;
  int iVar2;
  ulong local_a0;
  short *local_98;
  int16_t *state_low_ptr;
  int16_t *state_ptr;
  int16_t *filtered_low_ptr;
  int16_t *filtered_ptr;
  int16_t *a_ptr;
  int16_t *filteredFINAL_LOW_ptr;
  int16_t *filteredFINAL_ptr;
  int16_t *x_ptr;
  size_t stop;
  size_t j;
  size_t i;
  int32_t oLOW;
  int32_t o;
  size_t state_length_local;
  int16_t *state_local;
  size_t x_length_local;
  int16_t *x_local;
  size_t a_length_local;
  int16_t *a_local;
  
  filteredFINAL_LOW_ptr = filtered;
  a_ptr = filtered_low;
  filteredFINAL_ptr = x;
  for (j = 0; j < x_length; j = j + 1) {
    state_low_ptr = state + (state_length - 1);
    local_98 = state_low + (state_length - 1);
    i._4_4_ = (int)*filteredFINAL_ptr << 0xc;
    i._0_4_ = 0;
    local_a0 = a_length;
    if (j < a_length) {
      local_a0 = j + 1;
    }
    state_ptr = filtered_low + (j - 1);
    filtered_low_ptr = filtered + (j - 1);
    filtered_ptr = a + 1;
    for (stop = 1; sVar1 = j, stop < local_a0; stop = stop + 1) {
      i._4_4_ = i._4_4_ - (int)*filtered_ptr * (int)*filtered_low_ptr;
      i._0_4_ = (int)i - (int)*filtered_ptr * (int)*state_ptr;
      state_ptr = state_ptr + -1;
      filtered_low_ptr = filtered_low_ptr + -1;
      filtered_ptr = filtered_ptr + 1;
    }
    while (stop = sVar1 + 1, stop < a_length) {
      i._4_4_ = i._4_4_ - (int)*filtered_ptr * (int)*state_low_ptr;
      i._0_4_ = (int)i - (int)*filtered_ptr * (int)*local_98;
      local_98 = local_98 + -1;
      state_low_ptr = state_low_ptr + -1;
      filtered_ptr = filtered_ptr + 1;
      sVar1 = stop;
    }
    iVar2 = ((int)i >> 0xc) + i._4_4_;
    *filteredFINAL_LOW_ptr = (int16_t)(iVar2 + 0x800 >> 0xc);
    *a_ptr = (short)iVar2 + *filteredFINAL_LOW_ptr * -0x1000;
    a_ptr = a_ptr + 1;
    filteredFINAL_LOW_ptr = filteredFINAL_LOW_ptr + 1;
    filteredFINAL_ptr = filteredFINAL_ptr + 1;
  }
  if (x_length < state_length) {
    for (j = 0; j < state_length - x_length; j = j + 1) {
      state[j] = state[j + x_length];
      state_low[j] = state_low[j + x_length];
    }
    for (j = 0; j < x_length; j = j + 1) {
      state[(state_length - x_length) + j] = filtered[j];
      state[(state_length - x_length) + j] = filtered_low[j];
    }
  }
  else {
    WebRtcSpl_CopyFromEndW16(filtered,x_length,a_length - 1,state);
    WebRtcSpl_CopyFromEndW16(filtered_low,x_length,a_length - 1,state_low);
  }
  return x_length;
}

Assistant:

size_t WebRtcSpl_FilterAR(const int16_t* a,
                          size_t a_length,
                          const int16_t* x,
                          size_t x_length,
                          int16_t* state,
                          size_t state_length,
                          int16_t* state_low,
                          size_t state_low_length,
                          int16_t* filtered,
                          int16_t* filtered_low,
                          size_t filtered_low_length)
{
    int32_t o;
    int32_t oLOW;
    size_t i, j, stop;
    const int16_t* x_ptr = &x[0];
    int16_t* filteredFINAL_ptr = filtered;
    int16_t* filteredFINAL_LOW_ptr = filtered_low;

    for (i = 0; i < x_length; i++)
    {
        // Calculate filtered[i] and filtered_low[i]
        const int16_t* a_ptr = &a[1];
        int16_t* filtered_ptr = &filtered[i - 1];
        int16_t* filtered_low_ptr = &filtered_low[i - 1];
        int16_t* state_ptr = &state[state_length - 1];
        int16_t* state_low_ptr = &state_low[state_length - 1];

        o = (int32_t)(*x_ptr++) << 12;
        oLOW = (int32_t)0;

        stop = (i < a_length) ? i + 1 : a_length;
        for (j = 1; j < stop; j++)
        {
          o -= *a_ptr * *filtered_ptr--;
          oLOW -= *a_ptr++ * *filtered_low_ptr--;
        }
        for (j = i + 1; j < a_length; j++)
        {
          o -= *a_ptr * *state_ptr--;
          oLOW -= *a_ptr++ * *state_low_ptr--;
        }

        o += (oLOW >> 12);
        *filteredFINAL_ptr = (int16_t)((o + (int32_t)2048) >> 12);
        *filteredFINAL_LOW_ptr++ = (int16_t)(o - ((int32_t)(*filteredFINAL_ptr++)
                << 12));
    }

    // Save the filter state
    if (x_length >= state_length)
    {
        WebRtcSpl_CopyFromEndW16(filtered, x_length, a_length - 1, state);
        WebRtcSpl_CopyFromEndW16(filtered_low, x_length, a_length - 1, state_low);
    } else
    {
        for (i = 0; i < state_length - x_length; i++)
        {
            state[i] = state[i + x_length];
            state_low[i] = state_low[i + x_length];
        }
        for (i = 0; i < x_length; i++)
        {
            state[state_length - x_length + i] = filtered[i];
            state[state_length - x_length + i] = filtered_low[i];
        }
    }

    return x_length;
}